

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Clear(Extension *this)

{
  LazyMessageExtension *pLVar1;
  Arena *pAVar2;
  CppType CVar3;
  
  if (this->is_repeated == true) {
    CVar3 = anon_unknown_22::cpp_type(this->type);
    switch(CVar3) {
    case CPPTYPE_INT32:
    case CPPTYPE_INT64:
    case CPPTYPE_UINT32:
    case CPPTYPE_UINT64:
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_BOOL:
    case CPPTYPE_ENUM:
      ((this->field_0).repeated_int32_value)->current_size_ = 0;
      break;
    case CPPTYPE_STRING:
      RepeatedPtrFieldBase::
      Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)(this->field_0).string_value);
      return;
    case CPPTYPE_MESSAGE:
      RepeatedPtrFieldBase::
      Clear<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                ((RepeatedPtrFieldBase *)(this->field_0).string_value);
      return;
    }
  }
  else if ((this->field_0xa & 1) == 0) {
    CVar3 = anon_unknown_22::cpp_type(this->type);
    if (CVar3 == CPPTYPE_MESSAGE) {
      pAVar2 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_;
      if ((this->field_0xa & 0x10) == 0) {
        (*(code *)(pAVar2->impl_).options_.start_block_size)();
      }
      else {
        (*(code *)pAVar2->hooks_cookie_)();
      }
    }
    else if (CVar3 == CPPTYPE_STRING) {
      pLVar1 = (this->field_0).lazymessage_value;
      pLVar1[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
      *(undefined1 *)pLVar1->_vptr_LazyMessageExtension = 0;
    }
    this->field_0xa = (this->field_0xa & 0xf0) + 1;
  }
  return;
}

Assistant:

void ExtensionSet::Extension::Clear() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    repeated_##LOWERCASE##_value->Clear();  \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    if (!is_cleared) {
      switch (cpp_type(type)) {
        case WireFormatLite::CPPTYPE_STRING:
          string_value->clear();
          break;
        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_lazy) {
            lazymessage_value->Clear();
          } else {
            message_value->Clear();
          }
          break;
        default:
          // No need to do anything.  Get*() will return the default value
          // as long as is_cleared is true and Set*() will overwrite the
          // previous value.
          break;
      }

      is_cleared = true;
    }
  }
}